

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  CacheEntryType CVar5;
  int iVar6;
  pointer pbVar7;
  long lVar8;
  char *__s;
  long lVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  size_type sVar15;
  _Alloc_hider _Var16;
  mapped_type mVar17;
  string *key;
  string *key_00;
  bool bVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  string entryPattern;
  CacheEntryType type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string arg;
  string path;
  bool local_1b9;
  ulong local_1b8;
  undefined1 local_1a8 [44];
  uint local_17c;
  string local_178;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  *local_158;
  CacheEntryType local_14c;
  undefined1 local_148 [17];
  undefined7 uStack_137;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  long local_118 [2];
  cmake *local_108;
  undefined1 local_100 [184];
  char *local_48;
  
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar12 = 1;
  local_1b9 = 0x20 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7);
  if (local_1b9) {
    local_158 = &this->DiagLevels;
    local_17c = 0;
    local_1b8 = 1;
    local_108 = this;
    do {
      local_128._M_allocated_capacity = (size_type)local_118;
      pcVar1 = pbVar7[local_1b8]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar1,pcVar1 + pbVar7[local_1b8]._M_string_length);
      lVar8 = std::__cxx11::string::find(local_128._M_local_buf,0x523bf9,0);
      iVar6 = (int)local_1b8;
      if (lVar8 == 0) {
        std::__cxx11::string::substr((ulong)local_100,(ulong)&local_128);
        if ((char *)local_100._8_8_ == (char *)0x0) {
          local_1b8 = (ulong)(iVar6 + 1);
          if (local_1b8 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)local_100);
            goto LAB_0031ba93;
          }
          bVar3 = false;
          cmSystemTools::Error
                    ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
LAB_0031ba93:
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          local_178._M_string_length = 0;
          local_178.field_2._M_local_buf[0] = '\0';
          local_1a8._0_8_ = local_1a8 + 0x10;
          local_1a8._8_8_ = (string *)0x0;
          local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
          local_14c = UNINITIALIZED;
          bVar3 = cmState::ParseCacheEntry
                            ((string *)local_100,&local_178,(string *)local_1a8,&local_14c);
          if (bVar3) {
            local_148._0_8_ = local_148 + 0x10;
            local_148._8_8_ = (string *)0x0;
            local_148[0x10] = 0;
            if (this->WarnUnusedCli == true) {
              __s = cmState::GetInitializedCacheValue(this->State,&local_178);
              uVar2 = local_148._8_8_;
              bVar18 = __s != (char *)0x0;
              if (bVar18) {
                strlen(__s);
                bVar18 = true;
                std::__cxx11::string::_M_replace((ulong)local_148,0,(char *)uVar2,(ulong)__s);
              }
            }
            else {
              bVar18 = false;
            }
            cmState::AddCacheEntry
                      (this->State,&local_178,(char *)local_1a8._0_8_,
                       "No help, variable specified on the command line.",local_14c);
            UnwatchUnusedCli(this,&local_178);
            if (this->WarnUnusedCli == true) {
              if (bVar18) {
                cmState::GetInitializedCacheValue(this->State,&local_178);
                iVar6 = std::__cxx11::string::compare(local_148);
                if (iVar6 == 0) goto LAB_0031c022;
              }
              WatchUnusedCli(this,&local_178);
            }
LAB_0031c022:
            if ((string *)local_148._0_8_ != (string *)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_,CONCAT71(uStack_137,local_148[0x10]) + 1);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Parse error in command line argument: ",0x26);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_128._M_allocated_capacity,
                                 local_128._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"Should be: VAR:type=value\n",0x1a);
            cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          if ((string *)local_1a8._0_8_ != (string *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,
                            CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                     local_178.field_2._M_local_buf[0]) + 1);
          }
        }
LAB_0031c0ad:
        sVar15 = local_100._16_8_;
        _Var16._M_p = (pointer)local_100._0_8_;
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
LAB_0031c0ca:
          operator_delete(_Var16._M_p,sVar15 + 1);
        }
LAB_0031c0d2:
        uVar13 = (uint)local_1b8;
        if (bVar3 == false) {
LAB_0031c0db:
          local_1b8._0_4_ = uVar13;
          bVar3 = false;
        }
        else {
LAB_0031c20f:
          bVar3 = true;
        }
      }
      else {
        iVar4 = strncmp((char *)local_128._M_allocated_capacity,"-W",2);
        if (iVar4 != 0) {
          lVar8 = std::__cxx11::string::find(local_128._M_local_buf,0x512bbb,0);
          if (lVar8 == 0) {
            std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_128);
            if (local_178._M_string_length == 0) {
              local_1b8 = (ulong)(iVar6 + 1);
              if (local_1b8 <
                  (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                std::__cxx11::string::_M_assign((string *)&local_178);
                goto LAB_0031bdba;
              }
              bVar3 = false;
              cmSystemTools::Error
                        ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            else {
LAB_0031bdba:
              cmsys::Glob::PatternToRegex((string *)local_1a8,&local_178,true,true);
              local_48 = (char *)0x0;
              if ((string *)local_1a8._0_8_ != (string *)0x0) {
                cmsys::RegularExpression::compile
                          ((RegularExpression *)local_100,(char *)local_1a8._0_8_);
              }
              if ((string *)local_1a8._0_8_ != (string *)(local_1a8 + 0x10)) {
                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
              }
              local_1a8._0_8_ = (string *)0x0;
              local_1a8._8_8_ = (string *)0x0;
              local_1a8._16_8_ = 0;
              cmState::GetCacheEntryKeys_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_148,this->State);
              for (key = (string *)local_148._0_8_; key_00 = (string *)local_1a8._0_8_,
                  key != (string *)local_148._8_8_; key = key + 1) {
                CVar5 = cmState::GetCacheEntryType(this->State,key);
                if ((CVar5 != STATIC) &&
                   (bVar3 = cmsys::RegularExpression::find
                                      ((RegularExpression *)local_100,(key->_M_dataplus)._M_p),
                   bVar3)) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1a8,key);
                }
              }
              for (; key_00 != (string *)local_1a8._8_8_; key_00 = key_00 + 1) {
                cmState::RemoveCacheEntry(this->State,key_00);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_148);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1a8);
              if (local_48 != (char *)0x0) {
                operator_delete__(local_48);
              }
              bVar3 = true;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              sVar15 = CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                local_178.field_2._M_local_buf[0]);
              _Var16._M_p = local_178._M_dataplus._M_p;
              goto LAB_0031c0ca;
            }
            goto LAB_0031c0d2;
          }
          lVar8 = std::__cxx11::string::find(local_128._M_local_buf,0x4fc191,0);
          if (lVar8 == 0) {
            std::__cxx11::string::substr((ulong)local_100,(ulong)&local_128);
            if ((char *)local_100._8_8_ == (char *)0x0) {
              local_1b8 = (ulong)(iVar6 + 1);
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= local_1b8) {
                bVar3 = false;
                cmSystemTools::Error
                          ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0
                          );
                goto LAB_0031c0ad;
              }
              std::__cxx11::string::_M_assign((string *)local_100);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"loading initial cache file ",0x1b);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)local_100._0_8_,local_100._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            bVar3 = true;
            ReadListFile(this,args,(char *)local_100._0_8_);
            goto LAB_0031c0ad;
          }
          lVar8 = std::__cxx11::string::find(local_128._M_local_buf,0x4fc1be,0);
          if (lVar8 != 0) {
            lVar8 = std::__cxx11::string::find(local_128._M_local_buf,0x512c40,0);
            local_17c = local_17c & 0xff;
            if (lVar8 == 0) {
              local_17c = 1;
            }
            goto LAB_0031c20f;
          }
          uVar13 = iVar6 + 1;
          local_1b8 = (ulong)uVar13;
          pbVar7 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5) <=
              local_1b8) {
            bVar3 = false;
            cmSystemTools::Error
                      ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
            local_1b8._0_4_ = uVar13;
            goto LAB_0031c212;
          }
          local_100._0_8_ = local_100 + 0x10;
          pcVar1 = pbVar7[local_1b8]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_100,pcVar1,pcVar1 + pbVar7[local_1b8]._M_string_length);
          uVar2 = local_100._8_8_;
          if ((char *)local_100._8_8_ == (char *)0x0) {
            cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else {
            ReadListFile(this,args,(char *)local_100._0_8_);
          }
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
          }
          if ((char *)uVar2 != (char *)0x0) goto LAB_0031c20f;
          goto LAB_0031c0db;
        }
        std::__cxx11::string::substr((ulong)local_100,(ulong)&local_128);
        if ((char *)local_100._8_8_ == (char *)0x0) {
          local_1b8 = (ulong)(iVar6 + 1);
          if (local_1b8 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)local_100);
            goto LAB_0031bbd7;
          }
          bVar3 = false;
          cmSystemTools::Error
                    ("-W must be followed with [no-]<name>.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
LAB_0031bbd7:
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          local_178._M_string_length = 0;
          local_178.field_2._M_local_buf[0] = '\0';
          lVar8 = std::__cxx11::string::find(local_100,0x512b96,0);
          lVar9 = std::__cxx11::string::find(local_100,0x512b9a,(ulong)((uint)(lVar8 == 0) * 3));
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_100);
          std::__cxx11::string::operator=((string *)&local_178,(string *)local_1a8);
          if ((string *)local_1a8._0_8_ != (string *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          this = local_108;
          bVar3 = local_178._M_string_length != 0;
          if (local_178._M_string_length == 0) {
            cmSystemTools::Error("No warning name provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else if (lVar8 == 0 || lVar9 == 0) {
            if (lVar8 == 0 && lVar9 != 0) {
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](local_158,&local_178);
              *pmVar10 = DIAG_IGNORE;
            }
            else {
              if ((lVar8 == 0) || (lVar9 != 0)) {
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](local_158,&local_178);
                mVar17 = *pmVar10;
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](local_158,&local_178);
                if (0 < (int)mVar17) {
                  mVar17 = DIAG_WARN;
                }
                goto LAB_0031c10d;
              }
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](local_158,&local_178);
              *pmVar10 = DIAG_ERROR;
            }
          }
          else {
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                      ::operator[](local_158,&local_178);
            mVar17 = *pmVar10;
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                      ::operator[](local_158,&local_178);
            if ((int)mVar17 < 2) {
              mVar17 = DIAG_WARN;
            }
LAB_0031c10d:
            *pmVar10 = mVar17;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,
                            CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                     local_178.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
        if (bVar3) goto LAB_0031c20f;
        bVar3 = false;
      }
LAB_0031c212:
      if ((long *)local_128._M_allocated_capacity != local_118) {
        operator_delete((void *)local_128._M_allocated_capacity,local_118[0] + 1);
      }
      if (!bVar3) break;
      local_1b8 = (ulong)((uint)local_1b8 + 1);
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5;
      local_1b9 = local_1b8 < uVar14;
    } while (local_1b8 < uVar14);
    bVar12 = (byte)local_17c ^ 1;
  }
  bVar3 = (bool)(local_1b9 ^ 1);
  if ((local_1b9 == false) && ((bVar12 & 1) == 0)) {
    bVar3 = FindPackage(this,args);
  }
  return bVar3;
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-D",0) == 0)
      {
      std::string entry = arg.substr(2);
      if(entry.empty())
        {
        ++i;
        if(i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
          }
        }
      std::string var, value;
      cmState::CacheEntryType type = cmState::UNINITIALIZED;
      if(cmState::ParseCacheEntry(entry, var, value, type))
        {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if(this->WarnUnusedCli)
          {
          if(const char *v = this->State->GetInitializedCacheValue(var))
            {
            haveValue = true;
            cachedValue = v;
            }
          }

        this->AddCacheEntry(var, value.c_str(),
          "No help, variable specified on the command line.", type);

        if(this->WarnUnusedCli)
          {
          if (!haveValue ||
              cachedValue != this->State->GetInitializedCacheValue(var))
            {
            this->WatchUnusedCli(var);
            }
          }
        }
      else
        {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      }
    else if(cmHasLiteralPrefix(arg, "-W"))
      {
      std::string entry = arg.substr(2);
      if (entry.empty())
        {
        ++i;
        if (i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-W must be followed with [no-]<name>.");
          return false;
          }
        }

      std::string name;
      bool foundNo = false;
      bool foundError = false;
      unsigned int nameStartPosition = 0;

      if (entry.find("no-", nameStartPosition) == 0)
        {
        foundNo = true;
        nameStartPosition += 3;
        }

      if (entry.find("error=", nameStartPosition) == 0)
        {
        foundError = true;
        nameStartPosition += 6;
        }

      name = entry.substr(nameStartPosition);
      if (name.empty())
        {
        cmSystemTools::Error("No warning name provided.");
        return false;
        }

      if (!foundNo && !foundError)
        {
        // -W<name>
        this->DiagLevels[name] = std::max(this->DiagLevels[name],
                                          DIAG_WARN);
        }
      else if (foundNo && !foundError)
        {
         // -Wno<name>
         this->DiagLevels[name] = DIAG_IGNORE;
        }
      else if (!foundNo && foundError)
        {
        // -Werror=<name>
        this->DiagLevels[name] = DIAG_ERROR;
        }
      else
        {
        // -Wno-error=<name>
        this->DiagLevels[name] = std::min(this->DiagLevels[name],
                                          DIAG_WARN);
        }
      }
    else if(arg.find("-U",0) == 0)
      {
      std::string entryPattern = arg.substr(2);
      if(entryPattern.empty())
        {
        ++i;
        if(i < args.size())
          {
          entryPattern = args[i];
          }
        else
          {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
          }
        }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      //go through all cache entries and collect the vars which will be removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::vector<std::string>::const_iterator it = cacheKeys.begin();
            it != cacheKeys.end(); ++it)
        {
        cmState::CacheEntryType t = this->State->GetCacheEntryType(*it);
        if(t != cmState::STATIC)
          {
          if (regex.find(it->c_str()))
            {
            entriesToDelete.push_back(*it);
            }
          }
        }

      // now remove them from the cache
      for(std::vector<std::string>::const_iterator currentEntry =
          entriesToDelete.begin();
          currentEntry != entriesToDelete.end();
          ++currentEntry)
        {
        this->State->RemoveCacheEntry(*currentEntry);
        }
      }
    else if(arg.find("-C",0) == 0)
      {
      std::string path = arg.substr(2);
      if (path.empty())
        {
        ++i;
        if(i < args.size())
          {
          path = args[i];
          }
        else
          {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
          }
        }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path.c_str());
      }
    else if(arg.find("-P",0) == 0)
      {
      i++;
      if(i >= args.size())
        {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
        }
      std::string path = args[i];
      if (path.empty())
        {
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      this->ReadListFile(args, path.c_str());
      }
    else if (arg.find("--find-package",0) == 0)
      {
      findPackageMode = true;
      }
    }

  if (findPackageMode)
    {
    return this->FindPackage(args);
    }

  return true;
}